

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildSuperBlockEntropy_sequences
                 (seqStore_t *seqStorePtr,ZSTD_fseCTables_t *prevEntropy,
                 ZSTD_fseCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_fseCTablesMetadata_t *fseMetadata,void *workspace,size_t wkspSize)

{
  uint uVar1;
  size_t mostFrequent_00;
  seqStore_t *code;
  bool bVar2;
  size_t err_code_2;
  size_t countSize_2;
  size_t mostFrequent_2;
  uint max_2;
  U32 MLtype;
  size_t err_code_1;
  size_t countSize_1;
  size_t sStack_120;
  ZSTD_defaultPolicy_e defaultPolicy;
  size_t mostFrequent_1;
  uint max_1;
  U32 Offtype;
  size_t err_code;
  size_t countSize;
  size_t mostFrequent;
  uint max;
  U32 LLtype;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  size_t nbSeq;
  BYTE *mlCodeTable;
  BYTE *llCodeTable;
  BYTE *ofCodeTable;
  FSE_CTable *CTable_MatchLength;
  FSE_CTable *CTable_OffsetBits;
  FSE_CTable *CTable_LitLength;
  ulong uStack_98;
  ZSTD_strategy strategy;
  size_t cTableWkspSize;
  BYTE *cTableWksp;
  size_t countWkspSize;
  uint *countWksp;
  BYTE *countWkspStart;
  BYTE *wkspEnd;
  BYTE *wkspStart;
  void *workspace_local;
  ZSTD_fseCTablesMetadata_t *fseMetadata_local;
  ZSTD_CCtx_params *cctxParams_local;
  ZSTD_fseCTables_t *nextEntropy_local;
  ZSTD_fseCTables_t *prevEntropy_local;
  seqStore_t *seqStorePtr_local;
  
  countWkspStart = (BYTE *)((long)workspace + wkspSize);
  cTableWksp = (BYTE *)0xd4;
  cTableWkspSize = (long)workspace + 0xd4;
  uStack_98 = (long)countWkspStart - cTableWkspSize;
  CTable_LitLength._4_4_ = (cctxParams->cParams).strategy;
  CTable_OffsetBits = nextEntropy->litlengthCTable;
  ofCodeTable = (BYTE *)nextEntropy->matchlengthCTable;
  llCodeTable = seqStorePtr->ofCode;
  mlCodeTable = seqStorePtr->llCode;
  nbSeq = (size_t)seqStorePtr->mlCode;
  ostart = (BYTE *)((long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart >> 3);
  _max = fseMetadata->fseTablesBuffer;
  op = (BYTE *)&fseMetadata->fseTablesSize;
  oend = _max;
  CTable_MatchLength = nextEntropy->offcodeCTable;
  countWkspSize = (size_t)workspace;
  countWksp = (uint *)workspace;
  wkspEnd = (BYTE *)workspace;
  wkspStart = (BYTE *)workspace;
  workspace_local = fseMetadata;
  fseMetadata_local = (ZSTD_fseCTablesMetadata_t *)cctxParams;
  cctxParams_local = (ZSTD_CCtx_params *)nextEntropy;
  nextEntropy_local = prevEntropy;
  prevEntropy_local = (ZSTD_fseCTables_t *)seqStorePtr;
  if (uStack_98 < 0x200) {
    __assert_fail("cTableWkspSize >= (1 << MaxFSELog) * sizeof(FSE_FUNCTION_TYPE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x25f7,
                  "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                 );
  }
  memset(workspace,0,wkspSize);
  *(undefined8 *)((long)workspace_local + 0x208) = 0;
  ZSTD_seqToCodes((seqStore_t *)prevEntropy_local);
  mostFrequent._0_4_ = 0x23;
  countSize = HIST_countFast_wksp((uint *)countWkspSize,(uint *)&mostFrequent,mlCodeTable,
                                  (size_t)ostart,wkspStart,wkspSize);
  cctxParams_local[0x18].rsyncable = nextEntropy_local->litlength_repeatMode;
  mostFrequent._4_4_ =
       ZSTD_selectEncodingType
                 ((FSE_repeat *)&cctxParams_local[0x18].rsyncable,(uint *)countWkspSize,
                  (uint)mostFrequent,countSize,(size_t)ostart,9,nextEntropy_local->litlengthCTable,
                  LL_defaultNorm,6,ZSTD_defaultAllowed,CTable_LitLength._4_4_);
  bVar2 = false;
  if (mostFrequent._4_4_ < set_compressed) {
    bVar2 = cctxParams_local[0x18].rsyncable != 0;
  }
  if (bVar2) {
    __assert_fail("!(LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x260a,
                  "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                 );
  }
  _max_1 = (seqStore_t *)
           ZSTD_buildCTable(_max,(long)op - (long)_max,CTable_OffsetBits,9,mostFrequent._4_4_,
                            (uint *)countWkspSize,(uint)mostFrequent,mlCodeTable,(size_t)ostart,
                            LL_defaultNorm,6,0x23,nextEntropy_local->litlengthCTable,0x524,
                            (void *)cTableWkspSize,uStack_98);
  err_code = (size_t)_max_1;
  uVar1 = ERR_isError((size_t)_max_1);
  if (uVar1 == 0) {
    if (mostFrequent._4_4_ == set_compressed) {
      *(size_t *)((long)workspace_local + 0x208) = err_code;
    }
    _max = _max + err_code;
    *(symbolEncodingType_e *)workspace_local = mostFrequent._4_4_;
    mostFrequent_1._0_4_ = 0x1f;
    sStack_120 = HIST_countFast_wksp((uint *)countWkspSize,(uint *)&mostFrequent_1,llCodeTable,
                                     (size_t)ostart,wkspStart,wkspSize);
    countSize_1._4_4_ = (ZSTD_defaultPolicy_e)((uint)mostFrequent_1 < 0x1d);
    *(FSE_repeat *)((long)&cctxParams_local[0x18].jobSize + 4) =
         nextEntropy_local->offcode_repeatMode;
    mostFrequent_1._4_4_ =
         ZSTD_selectEncodingType
                   ((FSE_repeat *)((long)&cctxParams_local[0x18].jobSize + 4),(uint *)countWkspSize,
                    (uint)mostFrequent_1,sStack_120,(size_t)ostart,8,
                    nextEntropy_local->offcodeCTable,OF_defaultNorm,5,countSize_1._4_4_,
                    CTable_LitLength._4_4_);
    bVar2 = false;
    if (mostFrequent_1._4_4_ < set_compressed) {
      bVar2 = *(int *)((long)&cctxParams_local[0x18].jobSize + 4) != 0;
    }
    if (bVar2) {
      __assert_fail("!(Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2622,
                    "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                   );
    }
    _max_2 = (seqStore_t *)
             ZSTD_buildCTable(_max,(long)op - (long)_max,CTable_MatchLength,8,mostFrequent_1._4_4_,
                              (uint *)countWkspSize,(uint)mostFrequent_1,llCodeTable,(size_t)ostart,
                              OF_defaultNorm,5,0x1c,nextEntropy_local->offcodeCTable,0x304,
                              (void *)cTableWkspSize,uStack_98);
    err_code_1 = (size_t)_max_2;
    uVar1 = ERR_isError((size_t)_max_2);
    if (uVar1 == 0) {
      if (mostFrequent_1._4_4_ == set_compressed) {
        *(size_t *)((long)workspace_local + 0x208) = err_code_1;
      }
      _max = _max + err_code_1;
      *(symbolEncodingType_e *)((long)workspace_local + 4) = mostFrequent_1._4_4_;
      mostFrequent_2._0_4_ = 0x34;
      mostFrequent_00 =
           HIST_countFast_wksp((uint *)countWkspSize,(uint *)&mostFrequent_2,(void *)nbSeq,
                               (size_t)ostart,wkspStart,wkspSize);
      cctxParams_local[0x18].overlapLog = nextEntropy_local->matchlength_repeatMode;
      mostFrequent_2._4_4_ =
           ZSTD_selectEncodingType
                     ((FSE_repeat *)&cctxParams_local[0x18].overlapLog,(uint *)countWkspSize,
                      (uint)mostFrequent_2,mostFrequent_00,(size_t)ostart,9,
                      nextEntropy_local->matchlengthCTable,ML_defaultNorm,6,ZSTD_defaultAllowed,
                      CTable_LitLength._4_4_);
      bVar2 = false;
      if (mostFrequent_2._4_4_ < set_compressed) {
        bVar2 = cctxParams_local[0x18].overlapLog != 0;
      }
      if (bVar2) {
        __assert_fail("!(MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2638,
                      "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                     );
      }
      code = (seqStore_t *)
             ZSTD_buildCTable(_max,(long)op - (long)_max,(FSE_CTable *)ofCodeTable,9,
                              mostFrequent_2._4_4_,(uint *)countWkspSize,(uint)mostFrequent_2,
                              (BYTE *)nbSeq,(size_t)ostart,ML_defaultNorm,6,0x34,
                              nextEntropy_local->matchlengthCTable,0x5ac,(void *)cTableWkspSize,
                              uStack_98);
      uVar1 = ERR_isError((size_t)code);
      seqStorePtr_local = code;
      if (uVar1 == 0) {
        if (mostFrequent_2._4_4_ == set_compressed) {
          *(seqStore_t **)((long)workspace_local + 0x208) = code;
        }
        _max = _max + (long)&code->sequencesStart;
        *(symbolEncodingType_e *)((long)workspace_local + 8) = mostFrequent_2._4_4_;
        if (500 < (ulong)((long)_max - (long)oend)) {
          __assert_fail("(size_t) (op-ostart) <= sizeof(fseMetadata->fseTablesBuffer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2643,
                        "size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t *, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, const ZSTD_CCtx_params *, ZSTD_fseCTablesMetadata_t *, void *, size_t)"
                       );
        }
        seqStorePtr_local = (seqStore_t *)(_max + -(long)oend);
      }
    }
    else {
      seqStorePtr_local = _max_2;
    }
  }
  else {
    seqStorePtr_local = _max_1;
  }
  return (size_t)seqStorePtr_local;
}

Assistant:

static size_t ZSTD_buildSuperBlockEntropy_sequences(seqStore_t* seqStorePtr,
                                              const ZSTD_fseCTables_t* prevEntropy,
                                                    ZSTD_fseCTables_t* nextEntropy,
                                              const ZSTD_CCtx_params* cctxParams,
                                                    ZSTD_fseCTablesMetadata_t* fseMetadata,
                                                    void* workspace, size_t wkspSize)
{
    BYTE* const wkspStart = (BYTE*)workspace;
    BYTE* const wkspEnd = wkspStart + wkspSize;
    BYTE* const countWkspStart = wkspStart;
    unsigned* const countWksp = (unsigned*)workspace;
    const size_t countWkspSize = (MaxSeq + 1) * sizeof(unsigned);
    BYTE* const cTableWksp = countWkspStart + countWkspSize;
    const size_t cTableWkspSize = wkspEnd-cTableWksp;
    ZSTD_strategy const strategy = cctxParams->cParams.strategy;
    FSE_CTable* CTable_LitLength = nextEntropy->litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->matchlengthCTable;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    size_t const nbSeq = seqStorePtr->sequences - seqStorePtr->sequencesStart;
    BYTE* const ostart = fseMetadata->fseTablesBuffer;
    BYTE* const oend = ostart + sizeof(fseMetadata->fseTablesBuffer);
    BYTE* op = ostart;

    assert(cTableWkspSize >= (1 << MaxFSELog) * sizeof(FSE_FUNCTION_TYPE));
    DEBUGLOG(5, "ZSTD_buildSuperBlockEntropy_sequences (nbSeq=%zu)", nbSeq);
    memset(workspace, 0, wkspSize);

    fseMetadata->lastCountSize = 0;
    /* convert length/distances into codes */
    ZSTD_seqToCodes(seqStorePtr);
    /* build CTable for Literal Lengths */
    {   U32 LLtype;
        unsigned max = MaxLL;
        size_t const mostFrequent = HIST_countFast_wksp(countWksp, &max, llCodeTable, nbSeq, workspace, wkspSize);  /* can't fail */
        DEBUGLOG(5, "Building LL table");
        nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
        LLtype = ZSTD_selectEncodingType(&nextEntropy->litlength_repeatMode,
                                        countWksp, max, mostFrequent, nbSeq,
                                        LLFSELog, prevEntropy->litlengthCTable,
                                        LL_defaultNorm, LL_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(set_basic < set_compressed && set_rle < set_compressed);
        assert(!(LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_LitLength, LLFSELog, (symbolEncodingType_e)LLtype,
                                                    countWksp, max, llCodeTable, nbSeq, LL_defaultNorm, LL_defaultNormLog, MaxLL,
                                                    prevEntropy->litlengthCTable, sizeof(prevEntropy->litlengthCTable),
                                                    cTableWksp, cTableWkspSize);
            FORWARD_IF_ERROR(countSize);
            if (LLtype == set_compressed)
                fseMetadata->lastCountSize = countSize;
            op += countSize;
            fseMetadata->llType = (symbolEncodingType_e) LLtype;
    }   }
    /* build CTable for Offsets */
    {   U32 Offtype;
        unsigned max = MaxOff;
        size_t const mostFrequent = HIST_countFast_wksp(countWksp, &max, ofCodeTable, nbSeq, workspace, wkspSize);  /* can't fail */
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
        Offtype = ZSTD_selectEncodingType(&nextEntropy->offcode_repeatMode,
                                        countWksp, max, mostFrequent, nbSeq,
                                        OffFSELog, prevEntropy->offcodeCTable,
                                        OF_defaultNorm, OF_defaultNormLog,
                                        defaultPolicy, strategy);
        assert(!(Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)Offtype,
                                                    countWksp, max, ofCodeTable, nbSeq, OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                                                    prevEntropy->offcodeCTable, sizeof(prevEntropy->offcodeCTable),
                                                    cTableWksp, cTableWkspSize);
            FORWARD_IF_ERROR(countSize);
            if (Offtype == set_compressed)
                fseMetadata->lastCountSize = countSize;
            op += countSize;
            fseMetadata->ofType = (symbolEncodingType_e) Offtype;
    }   }
    /* build CTable for MatchLengths */
    {   U32 MLtype;
        unsigned max = MaxML;
        size_t const mostFrequent = HIST_countFast_wksp(countWksp, &max, mlCodeTable, nbSeq, workspace, wkspSize);   /* can't fail */
        DEBUGLOG(5, "Building ML table (remaining space : %i)", (int)(oend-op));
        nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
        MLtype = ZSTD_selectEncodingType(&nextEntropy->matchlength_repeatMode,
                                        countWksp, max, mostFrequent, nbSeq,
                                        MLFSELog, prevEntropy->matchlengthCTable,
                                        ML_defaultNorm, ML_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(!(MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(op, oend - op, CTable_MatchLength, MLFSELog, (symbolEncodingType_e)MLtype,
                                                    countWksp, max, mlCodeTable, nbSeq, ML_defaultNorm, ML_defaultNormLog, MaxML,
                                                    prevEntropy->matchlengthCTable, sizeof(prevEntropy->matchlengthCTable),
                                                    cTableWksp, cTableWkspSize);
            FORWARD_IF_ERROR(countSize);
            if (MLtype == set_compressed)
                fseMetadata->lastCountSize = countSize;
            op += countSize;
            fseMetadata->mlType = (symbolEncodingType_e) MLtype;
    }   }
    assert((size_t) (op-ostart) <= sizeof(fseMetadata->fseTablesBuffer));
    return op-ostart;
}